

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall geemuboi::test::core::CpuTest_ld_e_mhl_Test::TestBody(CpuTest_ld_e_mhl_Test *this)

{
  bool bVar1;
  MockSpec<unsigned_char_(unsigned_short)> *this_00;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_01;
  pointer pIVar2;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  int local_c0;
  uint local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  Registers expected_regs;
  Action<unsigned_char_(unsigned_short)> local_88;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_ld_e_mhl_Test *local_10;
  CpuTest_ld_e_mhl_Test *this_local;
  
  (this->super_CpuTest).regs.f = 0xf0;
  (this->super_CpuTest).regs.h = 0xff;
  (this->super_CpuTest).regs.l = 0xee;
  local_10 = this;
  testing::Matcher<unsigned_short>::Matcher(&local_48,0xffee);
  MockMmu::gmock_read_byte(&local_30,&(this->super_CpuTest).mmu,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                      (&local_30,local_55,(void *)0x0);
  this_01 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0x63b,"mmu","read_byte(0xFFEE)");
  testing::Return<int>((testing *)&expected_regs.pc,0xdd);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_88,(ReturnAction *)&expected_regs.pc);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(this_01,&local_88);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_88);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&expected_regs.pc);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  CpuTest::execute_instruction(&this->super_CpuTest,'^');
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf0eeffdd00000000;
  expected_regs.a = '\x01';
  expected_regs.b = '\0';
  expected_regs.c = '\0';
  expected_regs.d = '\0';
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&gtest_ar.message_);
  pIVar2 = std::unique_ptr<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>::
           operator->(&(this->super_CpuTest).cpu);
  local_bc = (*pIVar2->_vptr_ICpu[1])();
  local_c0 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_b8,"cpu->get_cycles_executed()","2",&local_bc,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x646,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  return;
}

Assistant:

TEST_F(CpuTest, ld_e_mhl) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    regs.h = 0xFF;
    regs.l = 0xEE;

    EXPECT_CALL(mmu, read_byte(0xFFEE)).WillOnce(Return(0xDD));
    execute_instruction(0x5E);

    ICpu::Registers expected_regs{};
    expected_regs.e = 0xDD;
    expected_regs.h = 0xFF;
    expected_regs.l = 0xEE;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}